

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

int fmt::v8::detail::
    get_dynamic_spec<fmt::v8::detail::width_checker,fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t>>,fmt::v8::detail::error_handler>
              (void)

{
  ulong in_stack_00000008;
  long arg;
  undefined4 in_stack_00000018;
  
  switch(in_stack_00000018) {
  case 1:
    in_stack_00000008 = (ulong)(int)in_stack_00000008;
    break;
  case 2:
    in_stack_00000008 = in_stack_00000008 & 0xffffffff;
    goto LAB_00166046;
  case 3:
    break;
  case 4:
  case 6:
    goto switchD_00166018_caseD_4;
  case 5:
    if (arg < 0) goto LAB_00166033;
    goto switchD_00166018_caseD_4;
  default:
    fmt::v8::detail::throw_format_error("width is not integer");
  case 8:
    in_stack_00000008 = in_stack_00000008 & 0xffff;
    goto LAB_00166046;
  }
  if ((long)in_stack_00000008 < 0) {
LAB_00166033:
    fmt::v8::detail::throw_format_error("negative width");
  }
LAB_00166046:
  if (in_stack_00000008 >> 0x1f == 0) {
    return (int)in_stack_00000008;
  }
  fmt::v8::detail::throw_format_error("number is too big");
switchD_00166018_caseD_4:
  goto LAB_00166046;
}

Assistant:

FMT_CONSTEXPR auto get_dynamic_spec(FormatArg arg, ErrorHandler eh) -> int {
  unsigned long long value = visit_format_arg(Handler<ErrorHandler>(eh), arg);
  if (value > to_unsigned(max_value<int>())) eh.on_error("number is too big");
  return static_cast<int>(value);
}